

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::SSLClient::check_host_name(SSLClient *this,char *pattern,size_t pattern_len)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  const_iterator __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pattern_components;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if (((this->super_ClientImpl).host_._M_string_length == pattern_len) &&
     (bVar3 = std::operator==(&(this->super_ClientImpl).host_,pattern), bVar3)) {
    return true;
  }
  pattern_components.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pattern_components.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pattern_components.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/httplib/httplib.h:7847:13)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/httplib/httplib.h:7847:13)>
             ::_M_manager;
  local_48._M_unused._M_object = &pattern_components;
  detail::split(pattern,pattern + pattern_len,'.',
                (function<void_(const_char_*,_const_char_*)> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  __rhs = (this->host_components_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->host_components_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __lhs = pattern_components.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if ((long)pbVar1 - (long)__rhs ==
      (long)pattern_components.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)pattern_components.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    while ((bVar3 = __rhs == pbVar1, !bVar3 &&
           (((bVar4 = std::operator!=(__lhs,__rhs), !bVar4 ||
             (bVar4 = std::operator!=(__lhs,"*"), !bVar4)) ||
            ((sVar2 = __lhs->_M_string_length, sVar2 != 0 &&
             (((__lhs->_M_dataplus)._M_p[sVar2 - 1] == '*' &&
              (iVar5 = std::__cxx11::string::compare((ulong)__lhs,0,(string *)(sVar2 - 1)),
              iVar5 == 0))))))))) {
      __rhs = __rhs + 1;
      __lhs = __lhs + 1;
    }
  }
  else {
    bVar3 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pattern_components);
  return bVar3;
}

Assistant:

inline bool SSLClient::check_host_name(const char* pattern,
        size_t pattern_len) const {
        if (host_.size() == pattern_len && host_ == pattern) { return true; }

        // Wildcard match
        // https://bugs.launchpad.net/ubuntu/+source/firefox-3.0/+bug/376484
        std::vector<std::string> pattern_components;
        detail::split(&pattern[0], &pattern[pattern_len], '.',
            [&](const char* b, const char* e) {
            pattern_components.emplace_back(std::string(b, e));
        });

        if (host_components_.size() != pattern_components.size()) { return false; }

        auto itr = pattern_components.begin();
        for (const auto& h : host_components_) {
            auto& p = *itr;
            if (p != h && p != "*") {
                auto partial_match = (p.size() > 0 && p[p.size() - 1] == '*' &&
                    !p.compare(0, p.size() - 1, h));
                if (!partial_match) { return false; }
            }
            ++itr;
        }

        return true;
    }